

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O0

void __thiscall
bwtil::cw_bwt::cw_bwt
          (cw_bwt *this,string *input_string,cw_bwt_input_type input_type,uint k,bool verbose)

{
  undefined1 auVar1 [16];
  int iVar2;
  ostream *poVar3;
  void *this_00;
  undefined4 extraout_var;
  uint in_ECX;
  int in_EDX;
  EVP_PKEY_CTX *ctx;
  cw_bwt *in_RDI;
  byte in_R8B;
  __type _Var4;
  undefined8 extraout_XMM0_Qb;
  uint log_n;
  ContextAutomata *in_stack_fffffffffffffea8;
  ContextAutomata *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffec8;
  BackwardStringIterator *in_stack_fffffffffffffed0;
  BackwardIterator *in_stack_fffffffffffffed8;
  undefined1 verbose_00;
  BackwardIterator *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  uint k_00;
  ContextAutomata *in_stack_fffffffffffffef0;
  string *path;
  BackwardFileIterator *this_01;
  EVP_PKEY_CTX local_d0 [160];
  uint local_30;
  byte local_19;
  uint local_18;
  int local_14;
  
  k_00 = (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_19 = in_R8B & 1;
  local_18 = in_ECX;
  local_14 = in_EDX;
  ContextAutomata::ContextAutomata(in_stack_fffffffffffffeb0);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::vector
            ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)0x130408);
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
            *)0x130421);
  path = (string *)&in_RDI->frequencies;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x13043a);
  this_01 = (BackwardFileIterator *)&in_RDI->lengths;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x130453);
  in_RDI->verbose = (bool)(local_19 & 1);
  in_RDI->k = local_18;
  if (local_18 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error: context length must be k>0");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  if ((local_19 & 1) != 0) {
    in_stack_fffffffffffffef0 =
         (ContextAutomata *)std::operator<<((ostream *)&std::cout,"\nContext length is k = ");
    this_00 = (void *)std::ostream::operator<<(in_stack_fffffffffffffef0,local_18);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    k_00 = (uint)((ulong)this_00 >> 0x20);
  }
  if (local_14 == 0) {
    in_stack_fffffffffffffee0 = (BackwardIterator *)operator_new(0x60);
    BackwardFileIterator::BackwardFileIterator(this_01,path);
    in_RDI->bwIt = in_stack_fffffffffffffee0;
  }
  else {
    in_stack_fffffffffffffed8 = (BackwardIterator *)operator_new(0x30);
    BackwardStringIterator::BackwardStringIterator
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    in_RDI->bwIt = in_stack_fffffffffffffed8;
  }
  verbose_00 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  iVar2 = (*in_RDI->bwIt->_vptr_BackwardIterator[6])();
  in_RDI->n = CONCAT44(extraout_var,iVar2);
  if (in_RDI->n <= (ulong)local_18) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Error: File length n must be n>k, where k is the context length.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  _Var4 = std::log2<unsigned_long>(0x13066e);
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_8_ = _Var4;
  local_30 = vcvttsd2usi_avx512f(auVar1);
  if (local_30 <= local_18) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Error: k is too large. k must be <= log_s(n), where s is the alphabet size."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  ContextAutomata::ContextAutomata
            (in_stack_fffffffffffffef0,k_00,in_stack_fffffffffffffee0,(bool)verbose_00);
  ctx = local_d0;
  ContextAutomata::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  ContextAutomata::~ContextAutomata(in_stack_fffffffffffffeb0);
  init(in_RDI,ctx);
  if (in_RDI->bwIt != (BackwardIterator *)0x0) {
    (*in_RDI->bwIt->_vptr_BackwardIterator[1])();
  }
  return;
}

Assistant:

cw_bwt(string &input_string, cw_bwt_input_type input_type, uint k, bool verbose=false){

		this->verbose=verbose;
		this->k = k;

		if(k==0){
			cout << "Error: context length must be k>0" << endl;
			exit(0);
		}

		if(verbose) cout << "\nContext length is k = " << k << endl;

		if(input_type==path)
			bwIt = new BackwardFileIterator(input_string);
		else
			bwIt = new BackwardStringIterator(input_string);

		n = bwIt->length();

		if(n<=k){
			cout << "Error: File length n must be n>k, where k is the context length." << endl;
			exit(0);
		}

		uint log_n = log2(n);

		if(k>=log_n){
			cout << "Error: k is too large. k must be <= log_s(n), where s is the alphabet size." << endl;
			exit(0);
		}

		ca = ContextAutomata(k, bwIt, verbose);

		init();

		delete bwIt;

	}